

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing_reorder.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateHitObjectInstructionCommonParameters
          (ValidationState_t *_,Instruction *inst,uint32_t acceleration_struct_index,
          uint32_t instance_id_index,uint32_t primtive_id_index,uint32_t geometry_index,
          uint32_t ray_flags_index,uint32_t cull_mask_index,uint32_t hit_kind_index,
          uint32_t sbt_index,uint32_t sbt_offset_index,uint32_t sbt_stride_index,
          uint32_t sbt_record_offset_index,uint32_t sbt_record_stride_index,uint32_t miss_index,
          uint32_t ray_origin_index,uint32_t ray_tmin_index,uint32_t ray_direction_index,
          uint32_t ray_tmax_index,uint32_t payload_index,uint32_t hit_object_attr_index)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  StorageClass SVar4;
  spv_result_t sVar5;
  DiagnosticStream *pDVar6;
  DiagnosticStream local_23f0;
  Op local_2214;
  Instruction *pIStack_2210;
  Op var_opcode_1;
  Instruction *variable_1;
  undefined1 local_2200 [4];
  uint32_t hit_object_attr_id;
  uint32_t local_2024;
  undefined1 local_2020 [4];
  uint32_t hit_kind_id;
  Op local_1e44;
  Instruction *pIStack_1e40;
  Op var_opcode;
  Instruction *variable;
  undefined1 local_1e30 [4];
  uint32_t payload_id;
  uint32_t local_1c54;
  undefined1 local_1c50 [4];
  uint32_t ray_flags_id;
  uint32_t local_1a74;
  undefined1 local_1a70 [4];
  uint32_t ray_tmax_id;
  uint32_t local_1894;
  undefined1 local_1890 [4];
  uint32_t ray_direction_id;
  uint32_t local_16b4;
  undefined1 local_16b0 [4];
  uint32_t ray_tmin_id;
  uint32_t local_14d4;
  undefined1 local_14d0 [4];
  uint32_t ray_origin_id;
  uint32_t local_12f4;
  undefined1 local_12f0 [4];
  uint32_t sbt_record_stride_index_id;
  uint32_t local_1114;
  undefined1 local_1110 [4];
  uint32_t sbt_record_offset_index_id;
  uint32_t local_f34;
  undefined1 local_f30 [4];
  uint32_t sbt_stride_index_id;
  uint32_t local_d54;
  undefined1 local_d50 [4];
  uint32_t sbt_offset_id;
  uint32_t local_b74;
  undefined1 local_b70 [4];
  uint32_t sbt_index_id;
  uint32_t local_994;
  undefined1 local_990 [4];
  uint32_t cull_mask_id;
  uint32_t local_7b4;
  undefined1 local_7b0 [4];
  uint32_t miss_index_id;
  uint32_t local_5d4;
  undefined1 local_5d0 [4];
  uint32_t geometry_index_id;
  uint32_t local_3f4;
  undefined1 local_3f0 [4];
  uint32_t primitive_id;
  uint32_t local_214;
  undefined1 local_210 [4];
  uint32_t instance_id;
  anon_class_1_0_00000001 local_31;
  uint32_t local_30;
  uint32_t uStack_2c;
  anon_class_1_0_00000001 isValidId;
  uint32_t geometry_index_local;
  uint32_t primtive_id_index_local;
  uint32_t instance_id_index_local;
  uint32_t acceleration_struct_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_30 = geometry_index;
  uStack_2c = primtive_id_index;
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,acceleration_struct_index);
  if (bVar1) {
    uVar3 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)acceleration_struct_index);
    OVar2 = ValidationState_t::GetIdOpcode(_,uVar3);
    if (OVar2 != OpTypeAccelerationStructureKHR) {
      ValidationState_t::diag((DiagnosticStream *)local_210,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_210,
                          (char (*) [77])
                          "Expected Acceleration Structure to be of type OpTypeAccelerationStructureKHR"
                         );
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_210);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,instance_id_index);
  if (bVar1) {
    local_214 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)instance_id_index);
    bVar1 = ValidationState_t::IsIntScalarType(_,local_214);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_214), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_3f0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_3f0,
                          (char (*) [40])"Instance Id must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f0);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,uStack_2c);
  if (bVar1) {
    local_3f4 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)uStack_2c);
    bVar1 = ValidationState_t::IsIntScalarType(_,local_3f4);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_3f4), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_5d0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_5d0,
                          (char (*) [41])"Primitive Id must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5d0);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,local_30);
  if (bVar1) {
    local_5d4 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)local_30);
    bVar1 = ValidationState_t::IsIntScalarType(_,local_5d4);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_5d4), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_7b0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_7b0,
                          (char (*) [43])"Geometry Index must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7b0);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,miss_index);
  if (bVar1) {
    local_7b4 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)miss_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_7b4);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_7b4), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_990,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_990,
                          (char (*) [39])"Miss Index must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_990);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,cull_mask_index);
  if (bVar1) {
    local_994 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)cull_mask_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_994);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_994), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_b70,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_b70,
                          (char (*) [38])"Cull mask must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_b70);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,sbt_index);
  if (bVar1) {
    local_b74 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_b74);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_b74), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_d50,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_d50,
                          (char (*) [47])"SBT Index must be a 32-bit unsigned int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_d50);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,sbt_offset_index);
  if (bVar1) {
    local_d54 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_offset_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_d54);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_d54), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_f30,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_f30,
                          (char (*) [48])"SBT Offset must be a 32-bit unsigned int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_f30);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,sbt_stride_index);
  if (bVar1) {
    local_f34 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_stride_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_f34);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_f34), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1110,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1110,
                          (char (*) [48])"SBT Stride must be a 32-bit unsigned int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1110);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,sbt_record_offset_index);
  if (bVar1) {
    local_1114 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_record_offset_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_1114);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_1114), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_12f0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_12f0,
                          (char (*) [55])"SBT record offset must be a 32-bit unsigned int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_12f0);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,sbt_record_stride_index);
  if (bVar1) {
    local_12f4 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_record_stride_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_12f4);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_12f4), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_14d0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_14d0,
                          (char (*) [55])"SBT record stride must be a 32-bit unsigned int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_14d0);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,ray_origin_index);
  if (bVar1) {
    local_14d4 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_origin_index);
    bVar1 = ValidationState_t::IsFloatVectorType(_,local_14d4);
    if (((!bVar1) || (uVar3 = ValidationState_t::GetDimension(_,local_14d4), uVar3 != 3)) ||
       (uVar3 = ValidationState_t::GetBitWidth(_,local_14d4), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_16b0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_16b0,
                          (char (*) [53])"Ray Origin must be a 32-bit float 3-component vector");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_16b0);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,ray_tmin_index);
  if (bVar1) {
    local_16b4 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_tmin_index);
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_16b4);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_16b4), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1890,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1890,
                          (char (*) [39])"Ray TMin must be a 32-bit float scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1890);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,ray_direction_index);
  if (bVar1) {
    local_1894 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_direction_index);
    bVar1 = ValidationState_t::IsFloatVectorType(_,local_1894);
    if (((!bVar1) || (uVar3 = ValidationState_t::GetDimension(_,local_1894), uVar3 != 3)) ||
       (uVar3 = ValidationState_t::GetBitWidth(_,local_1894), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1a70,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1a70,
                          (char (*) [56])"Ray Direction must be a 32-bit float 3-component vector");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1a70);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,ray_tmax_index);
  if (bVar1) {
    local_1a74 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_tmax_index);
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_1a74);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_1a74), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1c50,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1c50,
                          (char (*) [39])"Ray TMax must be a 32-bit float scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1c50);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,ray_flags_index);
  if (bVar1) {
    local_1c54 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_flags_index);
    bVar1 = ValidationState_t::IsIntScalarType(_,local_1c54);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_1c54), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1e30,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1e30,
                          (char (*) [38])"Ray Flags must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1e30);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,payload_index);
  if (bVar1) {
    variable._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)payload_index);
    pIStack_1e40 = ValidationState_t::FindDef(_,variable._4_4_);
    local_1e44 = Instruction::opcode(pIStack_1e40);
    if (((pIStack_1e40 == (Instruction *)0x0) || (local_1e44 != OpVariable)) ||
       ((SVar4 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_1e40,2),
        SVar4 != RayPayloadKHR &&
        (SVar4 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_1e40,2),
        SVar4 != IncomingRayPayloadKHR)))) {
      ValidationState_t::diag((DiagnosticStream *)local_2020,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_2020,
                          (char (*) [85])
                          "payload must be a OpVariable of storage class RayPayloadKHR or IncomingRayPayloadKHR"
                         );
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_2020);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,hit_kind_index);
  if (bVar1) {
    local_2024 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)hit_kind_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_2024);
    if ((!bVar1) || (uVar3 = ValidationState_t::GetBitWidth(_,local_2024), uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_2200,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_2200,
                          (char (*) [46])"Hit Kind must be a 32-bit unsigned int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_2200);
      return sVar5;
    }
  }
  bVar1 = ValidateHitObjectInstructionCommonParameters::anon_class_1_0_00000001::operator()
                    (&local_31,hit_object_attr_index);
  if (bVar1) {
    variable_1._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)hit_object_attr_index);
    pIStack_2210 = ValidationState_t::FindDef(_,variable_1._4_4_);
    local_2214 = Instruction::opcode(pIStack_2210);
    if (((pIStack_2210 == (Instruction *)0x0) || (local_2214 != OpVariable)) ||
       (SVar4 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_2210,2),
       SVar4 != HitObjectAttributeNV)) {
      ValidationState_t::diag(&local_23f0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_23f0,
                          (char (*) [84])
                          "Hit Object Attributes id must be a OpVariable of storage class HitObjectAttributeNV"
                         );
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_23f0);
      return sVar5;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateHitObjectInstructionCommonParameters(
    ValidationState_t& _, const Instruction* inst,
    uint32_t acceleration_struct_index, uint32_t instance_id_index,
    uint32_t primtive_id_index, uint32_t geometry_index,
    uint32_t ray_flags_index, uint32_t cull_mask_index, uint32_t hit_kind_index,
    uint32_t sbt_index, uint32_t sbt_offset_index, uint32_t sbt_stride_index,
    uint32_t sbt_record_offset_index, uint32_t sbt_record_stride_index,
    uint32_t miss_index, uint32_t ray_origin_index, uint32_t ray_tmin_index,
    uint32_t ray_direction_index, uint32_t ray_tmax_index,
    uint32_t payload_index, uint32_t hit_object_attr_index) {
  auto isValidId = [](uint32_t spvid) { return spvid < KRayParamInvalidId; };
  if (isValidId(acceleration_struct_index) &&
      _.GetIdOpcode(_.GetOperandTypeId(inst, acceleration_struct_index)) !=
          spv::Op::OpTypeAccelerationStructureKHR) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Acceleration Structure to be of type "
              "OpTypeAccelerationStructureKHR";
  }

  if (isValidId(instance_id_index)) {
    const uint32_t instance_id = _.GetOperandTypeId(inst, instance_id_index);
    if (!_.IsIntScalarType(instance_id) || _.GetBitWidth(instance_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Instance Id must be a 32-bit int scalar";
    }
  }

  if (isValidId(primtive_id_index)) {
    const uint32_t primitive_id = _.GetOperandTypeId(inst, primtive_id_index);
    if (!_.IsIntScalarType(primitive_id) || _.GetBitWidth(primitive_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Primitive Id must be a 32-bit int scalar";
    }
  }

  if (isValidId(geometry_index)) {
    const uint32_t geometry_index_id = _.GetOperandTypeId(inst, geometry_index);
    if (!_.IsIntScalarType(geometry_index_id) ||
        _.GetBitWidth(geometry_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Geometry Index must be a 32-bit int scalar";
    }
  }

  if (isValidId(miss_index)) {
    const uint32_t miss_index_id = _.GetOperandTypeId(inst, miss_index);
    if (!_.IsUnsignedIntScalarType(miss_index_id) ||
        _.GetBitWidth(miss_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Miss Index must be a 32-bit int scalar";
    }
  }

  if (isValidId(cull_mask_index)) {
    const uint32_t cull_mask_id = _.GetOperandTypeId(inst, cull_mask_index);
    if (!_.IsUnsignedIntScalarType(cull_mask_id) ||
        _.GetBitWidth(cull_mask_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Cull mask must be a 32-bit int scalar";
    }
  }

  if (isValidId(sbt_index)) {
    const uint32_t sbt_index_id = _.GetOperandTypeId(inst, sbt_index);
    if (!_.IsUnsignedIntScalarType(sbt_index_id) ||
        _.GetBitWidth(sbt_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT Index must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_offset_index)) {
    const uint32_t sbt_offset_id = _.GetOperandTypeId(inst, sbt_offset_index);
    if (!_.IsUnsignedIntScalarType(sbt_offset_id) ||
        _.GetBitWidth(sbt_offset_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT Offset must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_stride_index)) {
    const uint32_t sbt_stride_index_id =
        _.GetOperandTypeId(inst, sbt_stride_index);
    if (!_.IsUnsignedIntScalarType(sbt_stride_index_id) ||
        _.GetBitWidth(sbt_stride_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT Stride must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_record_offset_index)) {
    const uint32_t sbt_record_offset_index_id =
        _.GetOperandTypeId(inst, sbt_record_offset_index);
    if (!_.IsUnsignedIntScalarType(sbt_record_offset_index_id) ||
        _.GetBitWidth(sbt_record_offset_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT record offset must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_record_stride_index)) {
    const uint32_t sbt_record_stride_index_id =
        _.GetOperandTypeId(inst, sbt_record_stride_index);
    if (!_.IsUnsignedIntScalarType(sbt_record_stride_index_id) ||
        _.GetBitWidth(sbt_record_stride_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT record stride must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(ray_origin_index)) {
    const uint32_t ray_origin_id = _.GetOperandTypeId(inst, ray_origin_index);
    if (!_.IsFloatVectorType(ray_origin_id) ||
        _.GetDimension(ray_origin_id) != 3 ||
        _.GetBitWidth(ray_origin_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray Origin must be a 32-bit float 3-component vector";
    }
  }

  if (isValidId(ray_tmin_index)) {
    const uint32_t ray_tmin_id = _.GetOperandTypeId(inst, ray_tmin_index);
    if (!_.IsFloatScalarType(ray_tmin_id) || _.GetBitWidth(ray_tmin_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray TMin must be a 32-bit float scalar";
    }
  }

  if (isValidId(ray_direction_index)) {
    const uint32_t ray_direction_id =
        _.GetOperandTypeId(inst, ray_direction_index);
    if (!_.IsFloatVectorType(ray_direction_id) ||
        _.GetDimension(ray_direction_id) != 3 ||
        _.GetBitWidth(ray_direction_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray Direction must be a 32-bit float 3-component vector";
    }
  }

  if (isValidId(ray_tmax_index)) {
    const uint32_t ray_tmax_id = _.GetOperandTypeId(inst, ray_tmax_index);
    if (!_.IsFloatScalarType(ray_tmax_id) || _.GetBitWidth(ray_tmax_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray TMax must be a 32-bit float scalar";
    }
  }

  if (isValidId(ray_flags_index)) {
    const uint32_t ray_flags_id = _.GetOperandTypeId(inst, ray_flags_index);
    if (!_.IsIntScalarType(ray_flags_id) || _.GetBitWidth(ray_flags_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray Flags must be a 32-bit int scalar";
    }
  }

  if (isValidId(payload_index)) {
    const uint32_t payload_id = inst->GetOperandAs<uint32_t>(payload_index);
    auto variable = _.FindDef(payload_id);
    const auto var_opcode = variable->opcode();
    if (!variable || var_opcode != spv::Op::OpVariable ||
        (variable->GetOperandAs<spv::StorageClass>(2) !=
             spv::StorageClass::RayPayloadKHR &&
         variable->GetOperandAs<spv::StorageClass>(2) !=
             spv::StorageClass::IncomingRayPayloadKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "payload must be a OpVariable of storage "
                "class RayPayloadKHR or IncomingRayPayloadKHR";
    }
  }

  if (isValidId(hit_kind_index)) {
    const uint32_t hit_kind_id = _.GetOperandTypeId(inst, hit_kind_index);
    if (!_.IsUnsignedIntScalarType(hit_kind_id) ||
        _.GetBitWidth(hit_kind_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Hit Kind must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(hit_object_attr_index)) {
    const uint32_t hit_object_attr_id =
        inst->GetOperandAs<uint32_t>(hit_object_attr_index);
    auto variable = _.FindDef(hit_object_attr_id);
    const auto var_opcode = variable->opcode();
    if (!variable || var_opcode != spv::Op::OpVariable ||
        (variable->GetOperandAs<spv::StorageClass>(2)) !=
            spv::StorageClass::HitObjectAttributeNV) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Hit Object Attributes id must be a OpVariable of storage "
                "class HitObjectAttributeNV";
    }
  }

  return SPV_SUCCESS;
}